

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O0

bool __thiscall QNetworkCookieJar::insertCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RSI;
  QDateTime *in_RDI;
  long in_FS_OFFSET;
  bool isDeletion;
  QNetworkCookieJarPrivate *d;
  QDateTime now;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  uint7 in_stack_ffffffffffffffb8;
  byte bVar3;
  QDateTime local_18 [8];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QNetworkCookieJar *)0x1c0d1f);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDateTime::currentDateTimeUtc();
  bVar1 = QNetworkCookie::isSessionCookie((QNetworkCookie *)0x1c0d44);
  bVar3 = 0;
  if (!bVar1) {
    QNetworkCookie::expirationDate((QNetworkCookie *)(ulong)in_stack_ffffffffffffffb8);
    bVar3 = ::operator<(in_RDI,(QDateTime *)
                               CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )));
    QDateTime::~QDateTime(local_18);
  }
  bVar2 = bVar3 & 1;
  (**(code **)(*(long *)in_RDI + 0x80))(in_RDI,in_RSI);
  bVar1 = bVar2 == 0;
  if (bVar1) {
    QList<QNetworkCookie>::operator+=
              ((QList<QNetworkCookie> *)in_RDI,
               (parameter_type)
               CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
  }
  QDateTime::~QDateTime((QDateTime *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkCookieJar::insertCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const QDateTime now = QDateTime::currentDateTimeUtc();
    bool isDeletion = !cookie.isSessionCookie() &&
                      cookie.expirationDate() < now;

    deleteCookie(cookie);

    if (!isDeletion) {
        d->allCookies += cookie;
        return true;
    }
    return false;
}